

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

string * __thiscall
phosg::format_data_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,void *data,uint64_t size,
          uint64_t start_address,void *prev,uint64_t flags)

{
  uint64_t in_stack_ffffffffffffff90;
  uint64_t local_58;
  iovec prev_iov;
  iovec iov;
  uint64_t flags_local;
  void *prev_local;
  uint64_t start_address_local;
  uint64_t size_local;
  void *data_local;
  
  prev_iov.iov_len = (size_t)this;
  if (start_address == 0) {
    format_data_abi_cxx11_
              (__return_storage_ptr__,(phosg *)&prev_iov.iov_len,(iovec *)0x1,size,0,(iovec *)0x0,
               (size_t)prev,in_stack_ffffffffffffff90);
  }
  else {
    local_58 = start_address;
    prev_iov.iov_base = data;
    format_data_abi_cxx11_
              (__return_storage_ptr__,(phosg *)&prev_iov.iov_len,(iovec *)0x1,size,
               (uint64_t)&local_58,(iovec *)0x1,(size_t)prev,in_stack_ffffffffffffff90);
  }
  return __return_storage_ptr__;
}

Assistant:

string format_data(const void* data, uint64_t size, uint64_t start_address, const void* prev, uint64_t flags) {
  iovec iov;
  iov.iov_base = const_cast<void*>(data);
  iov.iov_len = size;
  if (prev) {
    iovec prev_iov;
    prev_iov.iov_base = const_cast<void*>(prev);
    prev_iov.iov_len = size;
    return format_data(&iov, 1, start_address, &prev_iov, 1, flags);
  } else {
    return format_data(&iov, 1, start_address, nullptr, 0, flags);
  }
}